

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_multisample_target.c
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ALLEGRO_FONT *pAVar6;
  char cVar7;
  long lVar8;
  undefined8 uVar9;
  long *plVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long lVar13;
  int i;
  ulong uVar14;
  uint uVar15;
  code *pcVar16;
  ulong uVar17;
  char *format;
  bool bVar18;
  int iVar19;
  bool bVar20;
  float fVar21;
  undefined4 uVar22;
  float fVar23;
  undefined4 uVar24;
  ALLEGRO_EVENT event;
  
  pcVar16 = atexit;
  cVar7 = al_install_system(0x85020700,atexit);
  if (cVar7 == '\0') {
    format = "Failed to init Allegro.\n";
  }
  else {
    cVar7 = al_init_image_addon();
    if (cVar7 == '\0') {
      format = "Failed to init IIO addon.\n";
    }
    else {
      al_init_font_addon();
      example.font = (ALLEGRO_FONT *)al_create_builtin_font();
      al_init_primitives_addon();
      pcVar16 = (code *)0x1cc;
      lVar8 = al_create_display(0x294,0x1cc);
      if (lVar8 == 0) {
        format = "Error creating display.\n";
      }
      else {
        cVar7 = al_install_keyboard();
        if (cVar7 != '\0') {
          al_set_new_bitmap_flags(1);
          uVar9 = al_create_bitmap(0x18,0x18);
          plVar10 = (long *)al_lock_bitmap(uVar9,0x11,0);
          iVar19 = *(int *)((long)plVar10 + 0xc);
          lVar13 = *plVar10 + 3;
          for (uVar14 = 0; uVar14 != 0x18; uVar14 = uVar14 + 1) {
            for (uVar17 = 0; uVar17 != 0x18; uVar17 = uVar17 + 1) {
              *(undefined2 *)(lVar13 + -3 + uVar17 * 4) = 0;
              *(undefined1 *)(lVar13 + -1 + uVar17 * 4) = 0;
              *(byte *)(lVar13 + uVar17 * 4) = -((char)(uVar17 >> 3) + (char)(uVar14 >> 3) & 1U);
            }
            lVar13 = lVar13 + iVar19;
          }
          al_unlock_bitmap(uVar9);
          bVar20 = false;
          al_set_new_bitmap_flags(0);
          al_set_new_bitmap_samples(0);
          example.targets[0] = (ALLEGRO_BITMAP *)al_create_bitmap(300,200);
          example.targets[1] = (ALLEGRO_BITMAP *)al_create_bitmap(300,200);
          al_set_new_bitmap_samples(4);
          example.targets[2] = (ALLEGRO_BITMAP *)al_create_bitmap(300,200);
          example.targets[3] = (ALLEGRO_BITMAP *)al_create_bitmap(300,200);
          al_set_new_bitmap_samples(0);
          al_set_new_bitmap_flags(0xc0);
          example.bitmap_filter = (ALLEGRO_BITMAP *)al_clone_bitmap(uVar9);
          al_set_new_bitmap_flags(0);
          example.bitmap_normal = (ALLEGRO_BITMAP *)al_clone_bitmap(uVar9);
          example.sub = (ALLEGRO_BITMAP *)al_create_sub_bitmap(uVar9,0,0,0x1e,0x1e);
          example.step[0] = (ALLEGRO_BITMAP *)al_create_bitmap(0x1e,0x1e);
          example.step[1] = (ALLEGRO_BITMAP *)al_create_bitmap(0x1e,0x1e);
          example.step[2] = (ALLEGRO_BITMAP *)al_create_bitmap(0x1e,0x1e);
          example.step[3] = (ALLEGRO_BITMAP *)al_create_bitmap(0x1e,0x1e);
          uVar9 = al_create_timer(0x11111111);
          uVar11 = al_create_event_queue();
          uVar12 = al_get_keyboard_event_source();
          al_register_event_source(uVar11,uVar12);
          uVar12 = al_get_timer_event_source(uVar9);
          al_register_event_source(uVar11,uVar12);
          uVar12 = al_get_display_event_source(lVar8);
          al_register_event_source(uVar11,uVar12);
          al_start_timer(uVar9);
          bVar18 = true;
          while (!bVar20) {
            if (bVar18) {
              al_set_target_bitmap(example.targets[1]);
              draw("filtered",example.bitmap_filter);
              al_set_target_bitmap(example.targets[0]);
              draw("no filter",example.bitmap_normal);
              al_set_target_bitmap(example.targets[3]);
              draw("filtered, multi-sample x4",example.bitmap_filter);
              al_set_target_bitmap(example.targets[2]);
              draw("no filter, multi-sample x4",example.bitmap_normal);
              if (example.update_step == true) {
                fVar21 = (float)example.step_y;
                fVar23 = (float)example.step_x;
                for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
                  al_set_target_bitmap(example.step[lVar8]);
                  al_reparent_bitmap(example.sub,example.targets[lVar8],(int)fVar23,(int)fVar21,0x1e
                                     ,0x1e);
                  __cxa_atexit(0,example.sub);
                }
                example.update_step = false;
              }
              uVar9 = al_get_current_display();
              al_set_target_backbuffer(uVar9);
              al_map_rgb_f(0x3f000000,0,0);
              al_clear_to_color();
              __cxa_atexit(0x41a00000,0x41a00000,example.targets[0],0);
              __cxa_atexit(0x41a00000,0x43700000,example.targets[1],0);
              __cxa_atexit(0x43aa0000,0x41a00000,example.targets[2],0);
              __cxa_atexit(0x43aa0000,0x43700000,example.targets[3],0);
              al_draw_scaled_rotated_bitmap
                        (0x41700000,0x41700000,0x43870000,0x432a0000,0x40800000,0x40800000,0,
                         example.step[0],0);
              al_draw_scaled_rotated_bitmap
                        (0x41700000,0x41700000,0x43870000,0x43c30000,0x40800000,0x40800000,
                         example.step[1],0);
              al_draw_scaled_rotated_bitmap
                        (0x41700000,0x41700000,0x44138000,0x432a0000,0x40800000,0x40800000,
                         example.step[2],0);
              al_draw_scaled_rotated_bitmap(example.step[3],0);
              al_flip_display();
            }
            bVar20 = false;
            bVar18 = false;
            do {
              al_wait_for_event(uVar11,&event);
              if (event.type == 0x2a) {
                bVar20 = true;
              }
              else if (event.type == 0x1e) {
                example.bitmap_t = example.bitmap_t + 1.0;
                iVar19 = 0;
                for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
                  dVar1 = sin((double)(((float)iVar19 + example.bitmap_t) / 180.0) *
                              3.141592653589793);
                  dVar2 = (double)((float)(int)lVar8 * 6.2831855 * 0.0625);
                  dVar3 = cos(dVar2);
                  example.bitmap_x[lVar8] = (float)(dVar3 * (double)((float)dVar1 * 90.0) + 100.0);
                  dVar2 = sin(dVar2);
                  example.bitmap_y[lVar8] = (float)(dVar2 * (double)((float)dVar1 * 90.0) + 100.0);
                  iVar19 = iVar19 + 0x28;
                }
                if (example.step_t == 0) {
                  example.step_y = (int)(example.bitmap_y[1] + -15.0);
                  example.step_x = (int)(example.bitmap_x[1] + -15.0);
                  example.update_step = true;
                  example.step_t = 0x3c;
                }
                example.step_t = example.step_t + -1;
                bVar18 = true;
              }
              else if (event.type == 0xb) {
                bVar20 = (bool)(bVar20 | event.display.width == 0x3b);
              }
              cVar7 = al_is_event_queue_empty(uVar11);
            } while (cVar7 == '\0');
          }
          return 0;
        }
        format = "Error installing keyboard.\n";
      }
    }
  }
  abort_example(format);
  al_color_name("white");
  al_clear_to_color();
  pAVar6 = example.font;
  al_map_rgb(0,0,0);
  iVar19 = al_draw_text(pAVar6,0,format);
  dVar1 = 0.0;
  for (uVar15 = 0; uVar15 != 0x1680; uVar15 = uVar15 + 0x168) {
    uVar24 = 0x3f800000;
    uVar22 = al_color_hsv((float)(uVar15 >> 4),0x3f800000,0x3f800000);
    dVar2 = (double)(float)(dVar1 * 6.283185307179586 * 0.0625);
    dVar3 = cos(dVar2);
    dVar4 = sin(dVar2);
    dVar5 = cos(dVar2);
    dVar2 = sin(dVar2);
    iVar19 = al_draw_line((float)(dVar3 * 10.0 + 100.0),(float)(dVar4 * 10.0 + 100.0),
                          (float)(dVar5 * 90.0 + 100.0),(float)(dVar2 * 90.0 + 100.0),uVar22,uVar24,
                          0x40400000);
    dVar1 = dVar1 + 1.0;
  }
  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
    iVar19 = al_get_bitmap_width(pcVar16);
    iVar19 = al_draw_rotated_bitmap
                       ((float)(iVar19 / 2),(float)(iVar19 / 2),example.bitmap_x[lVar8],
                        example.bitmap_y[lVar8],(float)(int)lVar8 * 6.2831855 * 0.0625,pcVar16,0,
                        (long)iVar19 % 2 & 0xffffffff);
  }
  return iVar19;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_DISPLAY *display;
   int w = 20 + 300 + 20 + 300 + 20, h = 20 + 200 + 20 + 200 + 20;
   bool done = false;
   bool need_redraw = true;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Failed to init Allegro.\n");
   }

   if (!al_init_image_addon()) {
      abort_example("Failed to init IIO addon.\n");
   }

   al_init_font_addon();
   example.font = al_create_builtin_font();

   al_init_primitives_addon();

   init_platform_specific();

   display = al_create_display(w, h);
   if (!display) {
      abort_example("Error creating display.\n");
   }

   if (!al_install_keyboard()) {
      abort_example("Error installing keyboard.\n");
   }

   init();

   timer = al_create_timer(1.0 / FPS);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());

   al_register_event_source(queue, al_get_timer_event_source(timer));
   
   al_register_event_source(queue, al_get_display_event_source(display));

   al_start_timer(timer);

   while (!done) {
      ALLEGRO_EVENT event;

      if (need_redraw) {
         redraw();
         al_flip_display();
         need_redraw = false;
      }

      while (true) {
         al_wait_for_event(queue, &event);
         switch (event.type) {
            case ALLEGRO_EVENT_KEY_CHAR:
               if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
                  done = true;
               break;

            case ALLEGRO_EVENT_DISPLAY_CLOSE:
               done = true;
               break;

            case ALLEGRO_EVENT_TIMER:
               update();
               need_redraw = true;
               break;
         }
         if (al_is_event_queue_empty(queue))
            break;
      }
   }

   return 0;
}